

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O0

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::MCol>
          (Structure *this,MCol *dest,FileDatabase *db)

{
  element_type *this_00;
  FileDatabase *db_local;
  MCol *dest_local;
  Structure *this_local;
  
  ReadField<2,char>(this,&dest->r,"r",db);
  ReadField<2,char>(this,&dest->g,"g",db);
  ReadField<2,char>(this,&dest->b,"b",db);
  ReadField<2,char>(this,&dest->a,"a",db);
  this_00 = ::std::
            __shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&db->reader);
  StreamReader<true,_true>::IncPtr(this_00,this->size);
  return;
}

Assistant:

void Structure :: Convert<MCol> (
    MCol& dest,
    const FileDatabase& db
    ) const
{

    ReadField<ErrorPolicy_Fail>(dest.r,"r",db);
    ReadField<ErrorPolicy_Fail>(dest.g,"g",db);
    ReadField<ErrorPolicy_Fail>(dest.b,"b",db);
    ReadField<ErrorPolicy_Fail>(dest.a,"a",db);

    db.reader->IncPtr(size);
}